

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O2

bool ghc::filesystem::create_directories(path *p,error_code *ec)

{
  bool bVar1;
  bool bVar2;
  error_category *peVar3;
  format fmt;
  bool bVar4;
  error_code tec;
  file_status fs;
  error_code tmp_ec;
  iterator __begin2;
  path folders;
  path current;
  iterator __end2;
  string_type part;
  
  current._path._M_dataplus._M_p = (pointer)&current._path.field_2;
  current._path._M_string_length = 0;
  current._path.field_2._M_local_buf[0] = '\0';
  std::error_code::clear(ec);
  path::root_name_length(p);
  path::has_root_directory(p);
  std::__cxx11::string::substr((ulong)&__begin2,(ulong)p);
  path::assign<std::__cxx11::string>
            (&current,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__begin2
            );
  std::__cxx11::string::~string((string *)&__begin2);
  std::__cxx11::string::substr((ulong)&__begin2,(ulong)p);
  path::path(&folders,(string_type *)&__begin2,fmt);
  std::__cxx11::string::~string((string *)&__begin2);
  path::begin(&__begin2,&folders);
  path::end(&__end2,&folders);
  bVar4 = false;
  do {
    if (__begin2._iter._M_current == __end2._iter._M_current) {
LAB_00157448:
      std::__cxx11::string::~string((string *)&__end2._current);
      std::__cxx11::string::~string((string *)&__begin2._current);
      std::__cxx11::string::~string((string *)&folders);
      std::__cxx11::string::~string((string *)&current);
      return bVar4;
    }
    std::__cxx11::string::string((string *)&part,(string *)&__begin2._current);
    path::append<std::__cxx11::string>(&current,&part);
    tec._M_value = 0;
    peVar3 = (error_category *)std::_V2::system_category();
    tec._M_cat = peVar3;
    status((filesystem *)&fs,&current,&tec);
    if (tec._M_value == 0) {
      if (fs._type < regular) goto LAB_001573ec;
      bVar1 = true;
      if (fs._type != directory) {
        ec->_M_value = 0x11;
        ec->_M_cat = peVar3;
        goto LAB_00157427;
      }
    }
    else if (fs._type == not_found) {
LAB_001573ec:
      create_directory(&current,ec);
      bVar1 = true;
      if (ec->_M_value != 0) {
        tmp_ec._M_value = 0;
        tmp_ec._M_cat = peVar3;
        bVar2 = is_directory(&current,&tmp_ec);
        if (!bVar2) goto LAB_00157427;
        std::error_code::clear(ec);
      }
      bVar4 = true;
    }
    else {
      *(ulong *)ec = CONCAT44(tec._4_4_,tec._M_value);
      ec->_M_cat = tec._M_cat;
LAB_00157427:
      bVar1 = false;
    }
    std::__cxx11::string::~string((string *)&part);
    if (!bVar1) {
      bVar4 = false;
      goto LAB_00157448;
    }
    path::iterator::operator++(&__begin2);
  } while( true );
}

Assistant:

GHC_INLINE bool create_directories(const path& p, std::error_code& ec) noexcept
{
    path current;
    ec.clear();
    bool didCreate = false;
    auto rootPathLen = p._prefixLength + p.root_name_length() + (p.has_root_directory() ? 1 : 0);
    current = p.native().substr(0, rootPathLen);
    path folders(p._path.substr(rootPathLen));
    for (path::string_type part : folders) {
        current /= part;
        std::error_code tec;
        auto fs = status(current, tec);
        if (tec && fs.type() != file_type::not_found) {
            ec = tec;
            return false;
        }
        if (!exists(fs)) {
            create_directory(current, ec);
            if (ec) {
                std::error_code tmp_ec;
                if (is_directory(current, tmp_ec)) {
                    ec.clear();
                }
                else {
                    return false;
                }
            }
            didCreate = true;
        }
#ifndef LWG_2935_BEHAVIOUR
        else if (!is_directory(fs)) {
            ec = detail::make_error_code(detail::portable_error::exists);
            return false;
        }
#endif
    }
    return didCreate;
}